

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_group.hpp
# Opt level: O0

void __thiscall boost::thread_group::~thread_group(thread_group *this)

{
  bool bVar1;
  reference pptVar2;
  shared_mutex *in_RDI;
  iterator end;
  iterator it;
  list<boost::thread_*,_std::allocator<boost::thread_*>_> *in_stack_ffffffffffffffd8;
  thread *ptVar3;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<boost::thread_*,_std::allocator<boost::thread_*>_>::begin
                 (in_stack_ffffffffffffffd8);
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<boost::thread_*,_std::allocator<boost::thread_*>_>::end
                 (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    pptVar2 = std::_List_iterator<boost::thread_*>::operator*
                        ((_List_iterator<boost::thread_*> *)in_RDI);
    ptVar3 = *pptVar2;
    if (ptVar3 != (thread *)0x0) {
      thread::~thread((thread *)in_RDI);
      operator_delete(ptVar3,0x10);
    }
    std::_List_iterator<boost::thread_*>::operator++(local_10);
  }
  shared_mutex::~shared_mutex(in_RDI);
  std::__cxx11::list<boost::thread_*,_std::allocator<boost::thread_*>_>::~list
            ((list<boost::thread_*,_std::allocator<boost::thread_*>_> *)0x27ea95);
  return;
}

Assistant:

~thread_group()
        {
            for(std::list<thread*>::iterator it=threads.begin(),end=threads.end();
                it!=end;
                ++it)
            {
                delete *it;
            }
        }